

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_applyNoCheck3
          (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_tuple_t argument0,
          sysbvm_tuple_t argument1,sysbvm_tuple_t argument2)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t arguments [3];
  sysbvm_tuple_t argument2_local;
  sysbvm_tuple_t argument1_local;
  sysbvm_tuple_t argument0_local;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  local_48 = argument0;
  arguments[0] = argument1;
  arguments[1] = argument2;
  arguments[2] = argument2;
  sVar1 = sysbvm_function_apply(context,function,3,&local_48,1);
  return sVar1;
}

Assistant:

SYSBVM_INLINE sysbvm_tuple_t sysbvm_function_applyNoCheck3(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_tuple_t argument0, sysbvm_tuple_t argument1, sysbvm_tuple_t argument2)
{
    sysbvm_tuple_t arguments[] = {
        argument0,
        argument1,
        argument2,
    };
    
    return sysbvm_function_apply(context, function, 3, arguments, SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK);
}